

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu.c
# Opt level: O0

void render_obj(gba_ppu_t *ppu)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  int iVar5;
  int iVar6;
  byte bVar7;
  bool bVar8;
  byte bVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  ushort *in_RDI;
  bool bVar14;
  bool bVar15;
  _Bool is_affine;
  _Bool is_double_affine;
  int hwidth;
  int hheight;
  int tiles_wide;
  int width;
  int height;
  int sprite;
  obj_attr2_t attr2;
  obj_attr1_t attr1;
  obj_attr0_t attr0;
  int x;
  uint16_t *warr;
  uint16_t *warr_8;
  uint16_t *warr_7;
  uint16_t *warr_6;
  uint16_t *warr_5;
  uint16_t *warr_4;
  uint16_t *warr_3;
  uint16_t *warr_2;
  uint16_t *warr_1;
  _Bool winout_display;
  _Bool winobj_display;
  _Bool win1_display;
  _Bool win0_display;
  _Bool is_winout;
  _Bool is_winobj;
  _Bool is_win1in;
  _Bool is_win0in;
  byte local_20a;
  bool local_208;
  bool local_206;
  int local_204;
  int local_200;
  int local_1f8;
  byte local_1f1;
  int local_1cc;
  int local_1c8;
  int local_1c4;
  int local_1c0;
  short local_1b4;
  short local_1b2;
  short local_1b0;
  short local_1ae;
  int local_1ac;
  uint local_1a8;
  int local_1a4;
  uint local_1a0;
  int local_19c;
  uint local_198;
  uint local_194;
  int local_178;
  int local_15c;
  uint32_t palette_address;
  uint8_t tile;
  int in_tile_offset;
  int in_tile_y;
  int in_tile_x;
  uint32_t tile_address;
  int tid_offset_by_x;
  int x_tid_offset;
  int screen_x;
  int tid;
  int sprite_tile_y;
  int y_tid_offset;
  int adjusted_sprite_y;
  int adjusted_sprite_x;
  int sprite_x;
  int sprite_x_end;
  int sprite_x_start;
  obj_affine_t affine;
  int screen_max_x;
  int screen_min_x;
  int screen_max_y;
  int screen_min_y;
  int sprite_y;
  int adjusted_y;
  int adjusted_x;
  
  for (local_15c = 0; local_15c < 0xf0; local_15c = local_15c + 1) {
    *(undefined1 *)((long)in_RDI + (long)local_15c + 0x26162) = 0;
    *(undefined1 *)((long)in_RDI + (long)local_15c + 0x26342) = 0;
    in_RDI[(long)local_15c + 0x12fc1] = in_RDI[0x13219];
    in_RDI[(long)local_15c + 0x12fc1] = in_RDI[(long)local_15c + 0x12fc1] & 0x7fff | 0x8000;
  }
  local_178 = 0;
  do {
    if (0x7f < local_178) {
      return;
    }
    uVar1 = *(ushort *)((long)in_RDI + (long)(local_178 << 3) + 0x3e832);
    uVar2 = *(ushort *)((long)in_RDI + (long)(local_178 * 8 + 2) + 0x3e832);
    uVar3 = *(ushort *)((long)in_RDI + (long)(local_178 * 8 + 4) + 0x3e832);
    iVar5 = sprite_heights[uVar1 >> 0xe][uVar2 >> 0xe];
    iVar6 = sprite_widths[uVar1 >> 0xe][uVar2 >> 0xe];
    iVar10 = iVar5 / 2;
    iVar11 = iVar6 / 2;
    bVar14 = (uVar1 >> 8 & 3) == 3;
    bVar15 = (uVar1 >> 8 & 3) != 1;
    local_194 = (uint)(uVar2 & 0x1ff);
    local_198 = (uint)(uVar1 & 0xff);
    if (bVar14) {
      local_194 = iVar11 + local_194;
      local_198 = iVar10 + local_198;
    }
    if (0xef < (int)local_194) {
      local_194 = local_194 - 0x200;
    }
    if (0x9f < (int)local_198) {
      local_198 = local_198 - 0x100;
    }
    local_19c = *in_RDI - local_198;
    if ((bVar15 && !bVar14) && ((uVar2 >> 0xd & 1) != 0)) {
      local_19c = (iVar5 - local_19c) + -1;
    }
    local_1a0 = local_198;
    local_1a4 = local_198 + iVar5;
    local_1a8 = local_194;
    local_1ac = local_194 + iVar6;
    if (bVar15 && !bVar14) {
      local_1b4 = 0xff;
      local_1b2 = 0;
      local_1b0 = 0;
      local_1ae = 0xff;
    }
    else {
      local_1b4 = *(short *)((long)in_RDI +
                            (long)(int)((uint)(uVar2 >> 9 & 0x1f) * 0x20 + 6) + 0x3e832);
      local_1b2 = *(short *)((long)in_RDI +
                            (long)(int)((uint)(uVar2 >> 9 & 0x1f) * 0x20 + 0xe) + 0x3e832);
      local_1b0 = *(short *)((long)in_RDI +
                            (long)(int)((uint)(uVar2 >> 9 & 0x1f) * 0x20 + 0x16) + 0x3e832);
      local_1ae = *(short *)((long)in_RDI +
                            (long)(int)((uint)(uVar2 >> 9 & 0x1f) * 0x20 + 0x1e) + 0x3e832);
      if (bVar14) {
        local_1a0 = local_198 - iVar10;
        local_1a4 = iVar10 + local_1a4;
        local_1a8 = (local_194 - iVar11) - iVar6 / 2;
        if ((int)local_1a8 < 0) {
          local_1a8 = 0;
        }
        local_1ac = iVar6 / 2 + iVar11 + local_1ac;
        if (local_1ac < 0xf0) {
          local_1ac = 0xf0;
        }
      }
    }
    if ((((int)local_1a0 <= (int)(uint)*in_RDI) && ((int)(uint)*in_RDI < local_1a4)) &&
       ((uVar1 >> 8 & 3) != 2)) {
      if (bVar14) {
        local_1c0 = -iVar11;
        local_204 = iVar6 + iVar11;
      }
      else {
        local_200 = 0;
        local_1c0 = local_200;
        local_204 = iVar6;
      }
      for (; local_1c0 < local_204; local_1c0 = local_1c0 + 1) {
        local_1c4 = local_1c0;
        local_1c8 = local_19c;
        if (bVar15 && !bVar14) {
          if ((uVar2 >> 0xc & 1) != 0) {
            local_1c4 = (iVar6 - local_1c0) + -1;
          }
LAB_00148940:
          bVar7 = (byte)(uVar1 >> 8);
          if ((in_RDI[0x1f61a] >> 6 & 1) == 0) {
            local_1cc = local_1c8 / 8 << 5;
          }
          else {
            local_1cc = (iVar6 / 8) * (local_1c8 / 8 << (bVar7 >> 5 & 1));
          }
          iVar12 = local_1c0 + local_194;
          if (((iVar12 < 0xf0) && (-1 < iVar12)) &&
             ((((int)local_1a8 <= iVar12 && (iVar12 < local_1ac)) &&
              (((short)in_RDI[(long)iVar12 + 0x12fc1] < 0 ||
               ((uVar3 >> 10 & 3) < (ushort)*(byte *)((long)in_RDI + (long)iVar12 + 0x26162))))))) {
            iVar13 = local_1c4 % 8 + (local_1c8 % 8) * 8;
            local_1f1 = *(byte *)((long)in_RDI +
                                 (ulong)((iVar13 >> ((bVar7 >> 5 & 1 ^ 0xff) & 1)) +
                                        ((uint)(uVar3 & 0x3ff) + local_1cc +
                                        (local_1c4 / 8 << (bVar7 >> 5 & 1))) * 0x20 + 0x10000) +
                                 0x26832);
            if ((uVar1 >> 0xd & 1) == 0) {
              local_1f1 = (byte)((int)(uint)local_1f1 >> ((byte)(iVar13 % 2 << 2) & 0x1f)) & 0xf;
            }
            if (local_1f1 != 0) {
              if ((uVar1 >> 0xd & 1) == 0) {
                local_1f8 = (uint)(uVar3 >> 0xc) * 0x20 + (uint)local_1f1 * 2;
              }
              else {
                local_1f8 = (uint)local_1f1 * 2;
              }
              local_1f8 = local_1f8 + 0x200;
              if ((uVar1 >> 10 & 3) == 2) {
                *(undefined1 *)((long)in_RDI + (long)iVar12 + 0x26342) = 1;
              }
              else {
                uVar4 = *in_RDI;
                tile_address._3_1_ = (byte)(in_RDI[0x1f64c] >> 4) & 1;
                local_206 = false;
                if (((int)(uint)(in_RDI[0x1f644] >> 8) <= iVar12) &&
                   (local_206 = false, iVar12 <= (int)(uint)(in_RDI[0x1f644] & 0xff))) {
                  local_206 = in_RDI[0x1f648] >> 8 <= uVar4 && uVar4 <= (in_RDI[0x1f648] & 0xff);
                }
                local_208 = false;
                if (((int)(uint)(in_RDI[0x1f646] >> 8) <= iVar12) &&
                   (local_208 = false, iVar12 <= (int)(uint)(in_RDI[0x1f646] & 0xff))) {
                  local_208 = in_RDI[0x1f64a] >> 8 <= uVar4 && uVar4 <= (in_RDI[0x1f64a] & 0xff);
                }
                bVar8 = true;
                if (!local_206) {
                  bVar8 = local_208;
                }
                bVar9 = (byte)(in_RDI[0x1f61a] >> 0xe) & 1;
                local_20a = 1;
                bVar7 = bVar9;
                if ((((((byte)(in_RDI[0x1f61a] >> 0xd) & 1) == 0) || (bVar7 = local_20a, !local_206)
                     ) && ((bVar9 == 0 ||
                           (tile_address._3_1_ = (byte)(in_RDI[0x1f64c] >> 0xc) & 1, !local_208))))
                   && (((-1 < (short)in_RDI[0x1f61a] ||
                        (tile_address._3_1_ = (byte)(in_RDI[0x1f64d] >> 0xc) & 1,
                        (*(byte *)((long)in_RDI + (long)iVar12 + 0x26342) & 1) == 0)) &&
                       ((bVar7 == 0 ||
                        (tile_address._3_1_ = (byte)(in_RDI[0x1f64d] >> 4) & 1, bVar8)))))) {
                  tile_address._3_1_ = 1;
                }
                if (tile_address._3_1_ != 0) {
                  *(byte *)((long)in_RDI + (long)iVar12 + 0x26162) = (byte)(uVar3 >> 10) & 3;
                  *(bool *)((long)in_RDI + (long)iVar12 + 0x26252) = (uVar1 >> 10 & 3) == 1;
                  in_RDI[(long)iVar12 + 0x12fc1] =
                       *(ushort *)((long)in_RDI + (long)local_1f8 + 0x26432);
                  in_RDI[(long)iVar12 + 0x12fc1] = in_RDI[(long)iVar12 + 0x12fc1] & 0x7fff;
                }
              }
            }
          }
        }
        else {
          local_1c4 = iVar11 + ((int)local_1b4 * (local_1c0 - iVar11) +
                                (int)local_1b2 * (local_19c - iVar10) >> 8);
          if (((local_1c4 < iVar6) && (-1 < local_1c4)) &&
             ((local_1c8 = iVar10 + ((int)local_1b0 * (local_1c0 - iVar11) +
                                     (int)local_1ae * (local_19c - iVar10) >> 8), local_1c8 < iVar5
              && (-1 < local_1c8)))) goto LAB_00148940;
        }
      }
    }
    local_178 = local_178 + 1;
  } while( true );
}

Assistant:

void render_obj(gba_ppu_t* ppu) {
    obj_attr0_t attr0;
    obj_attr1_t attr1;
    obj_attr2_t attr2;

    clear_obj(ppu);

    for (int sprite = 0; sprite < 128; sprite++) {
        attr0.raw = half_from_byte_array(ppu->oam, (sprite * 8) + 0);
        attr1.raw = half_from_byte_array(ppu->oam, (sprite * 8) + 2);
        attr2.raw = half_from_byte_array(ppu->oam, (sprite * 8) + 4);

        int height = sprite_heights[attr0.shape][attr1.size];
        int width = sprite_widths[attr0.shape][attr1.size];
        int tiles_wide = width / 8;

        int hheight = height / 2;
        int hwidth = width / 2;

        bool is_double_affine = attr0.affine_object_mode == OBJ_AFF_MODE_DOUBLE;
        bool is_affine = attr0.affine_object_mode == OBJ_AFF_MODE_AFFINE || is_double_affine;

        int adjusted_x = attr1.x;
        int adjusted_y = attr0.y;

        if (is_double_affine) {
            adjusted_x += hwidth;
            adjusted_y += hheight;
        }

        if (adjusted_x >= 240) {
            adjusted_x -= 512;
        }
        if (adjusted_y >= 160) {
            adjusted_y -= 256;
        }

        int sprite_y = ppu->y - adjusted_y;
        if (!is_affine && attr1.vflip) {
            sprite_y = height - sprite_y - 1;
        }

        int screen_min_y = adjusted_y;
        int screen_max_y = adjusted_y + height;

        int screen_min_x = adjusted_x;
        int screen_max_x = adjusted_x + width;


        obj_affine_t affine;
        if (is_affine) {
            affine.pa = half_from_byte_array(ppu->oam, attr1.affine_index * 32 + 6);
            affine.pb = half_from_byte_array(ppu->oam, attr1.affine_index * 32 + 14);
            affine.pc = half_from_byte_array(ppu->oam, attr1.affine_index * 32 + 22);
            affine.pd = half_from_byte_array(ppu->oam, attr1.affine_index * 32 + 30);
            if (is_double_affine) { // double rendering area
                screen_min_y -= hheight;
                screen_max_y += hheight;

                screen_min_x -= hwidth;
                screen_max_x += hwidth;

                screen_min_x -= (width / 2);
                if (screen_min_x < 0) {
                    screen_min_x = 0;
                }
                screen_max_x += (width / 2);
                if (screen_max_x < GBA_SCREEN_X) {
                    screen_max_x = GBA_SCREEN_X;
                }
            }

        } else {
            // Set to identity matrix
            affine.pa = 0xFF;
            affine.pb = 0x00;
            affine.pc = 0x00;
            affine.pd = 0xFF;
        }

        if (ppu->y >= screen_min_y && ppu->y < screen_max_y) { // If the sprite is visible, we should draw it.
            if (attr0.affine_object_mode != OBJ_AFF_MODE_HIDE) { // Not disabled
                int sprite_x_start = is_double_affine ? -hwidth : 0;
                int sprite_x_end   = is_double_affine ? width + hwidth : width;
                for (int sprite_x = sprite_x_start; sprite_x < sprite_x_end; sprite_x++) {
                    int adjusted_sprite_x = sprite_x;
                    int adjusted_sprite_y = sprite_y;

                    if (is_affine) {
                        adjusted_sprite_x = affine.pa * (sprite_x - hwidth) + affine.pb * (sprite_y - hheight);
                        adjusted_sprite_x >>= 8;
                        adjusted_sprite_x += hwidth;

                        if (adjusted_sprite_x >= width || adjusted_sprite_x < 0) {
                            continue;
                        }

                        adjusted_sprite_y = affine.pc * (sprite_x - hwidth) + affine.pd * (sprite_y - hheight);
                        adjusted_sprite_y >>= 8;
                        adjusted_sprite_y += hheight;

                        if (adjusted_sprite_y >= height || adjusted_sprite_y < 0) {
                            continue;
                        }

                    } else if (attr1.hflip) {
                        adjusted_sprite_x = width - sprite_x - 1;
                    }

                    int y_tid_offset;
                    int sprite_tile_y = adjusted_sprite_y / 8;
                    if (ppu->DISPCNT.obj_character_vram_mapping) { // 1D
                        // Tiles are twice as wide in 256 color mode
                        y_tid_offset = tiles_wide * (sprite_tile_y << attr0.is_256color);
                    } else { // 2D
                        y_tid_offset = 32 * sprite_tile_y;
                    }
                    // After adding this offset, we won't need to worry about 1D vs 2D,
                    // because in either case they'll be right next to each other in memory.
                    int tid = attr2.tid + y_tid_offset;

                    // Don't use the adjusted X or Y here. There'd be no point in transforming the sprite, otherwise.
                    int screen_x = sprite_x + adjusted_x;
                    // Only draw if we've never drawn anything there before. Lower indices have higher priority
                    // and that's the order we're drawing them here.
                    if (screen_x < GBA_SCREEN_X && screen_x >= 0 && screen_x >= screen_min_x && screen_x < screen_max_x && (ppu->objbuf[screen_x].transparent || attr2.priority < ppu->obj_priorities[screen_x])) {
                        // Tiles are twice as wide in 256 color mode
                        int x_tid_offset = (adjusted_sprite_x / 8) << attr0.is_256color;
                        int tid_offset_by_x = tid + x_tid_offset;
                        word tile_address = 0x10000 + tid_offset_by_x * OBJ_TILE_SIZE;

                        int in_tile_x = adjusted_sprite_x % 8;
                        int in_tile_y = adjusted_sprite_y % 8;

                        int in_tile_offset = in_tile_x + in_tile_y * 8;
                        tile_address += in_tile_offset >> (!attr0.is_256color);

                        byte tile = ppu->vram[tile_address];
                        if (!attr0.is_256color) {
                            tile >>= (in_tile_offset % 2) * 4;
                            tile &= 0xF;
                        }

                        if (tile != 0) {

                            word palette_address = 0x200; // OBJ palette base
                            if (attr0.is_256color) {
                                palette_address += 2 * tile;
                            } else {
                                palette_address += (0x20 * attr2.pb + 2 * tile);
                            }
                            if (attr0.graphics_mode == OBJ_MODE_OBJWIN) {
                                ppu->obj_window[screen_x] = true;
                            } else {
                                if (should_render_pixel_window(ppu, screen_x, ppu->y, ppu->WININ.win0_obj_enable, ppu->WININ.win1_obj_enable, ppu->WINOUT.outside_obj_enable, ppu->WINOUT.obj_obj_enable)) {
                                    ppu->obj_priorities[screen_x] = attr2.priority;
                                    ppu->obj_alpha[screen_x] = attr0.graphics_mode == OBJ_MODE_ALPHA;
                                    ppu->objbuf[screen_x].raw = half_from_byte_array(ppu->pram, palette_address);
                                    ppu->objbuf[screen_x].transparent = false;
                                }
                            }
                        }
                    }
                }
            }
        }
    }
}